

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

bool __thiscall
glcts::ViewportArray::DepthRangeDepthTest::checkResults
          (DepthRangeDepthTest *this,texture *texture_0,texture *param_2,GLuint draw_call_index)

{
  ostringstream *this_00;
  float fVar1;
  float fVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  vector<float,_std::allocator<float>_> texture_data;
  undefined1 local_1a0 [384];
  
  texture_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texture_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texture_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::resize(&texture_data,0x20);
  Utils::texture::get(texture_0,0x1903,0x1406,
                      texture_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
  fVar5 = (float)draw_call_index * 0.0625;
  uVar3 = 0;
  do {
    uVar4 = uVar3;
    if (uVar4 == 0x10) goto LAB_00d8d285;
    fVar1 = texture_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4];
    fVar2 = texture_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4 + 0x10];
  } while ((fVar1 < fVar5) && (uVar3 = uVar4 + 1, fVar2 < fVar5));
  local_1a0._0_8_ = ((this->super_DrawTestBase).super_TestCaseBase.m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Invalid values at ");
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::operator<<((ostream *)this_00," depth value ");
  std::ostream::operator<<(this_00,fVar5);
  std::operator<<((ostream *)this_00," got [");
  std::ostream::operator<<(this_00,fVar1);
  std::operator<<((ostream *)this_00,", ");
  std::ostream::operator<<(this_00,fVar2);
  std::operator<<((ostream *)this_00,"]");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
LAB_00d8d285:
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&texture_data.super__Vector_base<float,_std::allocator<float>_>);
  return 0xf < uVar4;
}

Assistant:

bool DepthRangeDepthTest::checkResults(Utils::texture& texture_0, Utils::texture& /* texture_1 */,
									   GLuint		   draw_call_index)
{
	static const GLfloat step = 1.0f / 16.0f;

	const GLfloat depth_value = step * (GLfloat)draw_call_index;

	bool check_result = true;

	std::vector<GLfloat> texture_data;
	texture_data.resize(m_r32f_width * m_r32f_height);
	texture_0.get(GL_RED, GL_FLOAT, &texture_data[0]);

	for (GLuint i = 0; i < 16; ++i)
	{
		/* Bottom row should contain near values, top one should contain far values */
		const GLfloat near = texture_data[i];
		const GLfloat far  = texture_data[i + 16];

		if ((depth_value <= near) || (depth_value <= far))
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid values at " << i << " depth value "
												<< depth_value << " got [" << near << ", " << far << "]"
												<< tcu::TestLog::EndMessage;

			check_result = false;
			break;
		}
	}

	return check_result;
}